

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismSearcher::propagate_adjacency_constraints<false,false,true,true>
          (HomomorphismSearcher *this,HomomorphismDomain *d,
          HomomorphismAssignment *current_assignment)

{
  uint uVar1;
  uint uVar2;
  long *in_RDI;
  uint g;
  conditional_t<true,_SVOBitset,_tuple<>_> before;
  PatternAdjacencyBitsType *graph_pairs_to_consider;
  int in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  uint in_stack_fffffffffffffde4;
  uint in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  SVOBitset *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  SVOBitset *in_stack_fffffffffffffe00;
  SVOBitset *this_00;
  HomomorphismModel *in_stack_fffffffffffffe48;
  uint local_13c;
  SVOBitset local_b0;
  byte local_21;
  byte *local_20;
  
  local_21 = HomomorphismModel::pattern_adjacency_bits
                       ((HomomorphismModel *)
                        CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                        in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8);
  local_20 = &local_21;
  this_00 = &local_b0;
  SVOBitset::SVOBitset(this_00);
  SVOBitset::operator=
            ((SVOBitset *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0);
  if ((*local_20 & 1) == 0) {
    HomomorphismModel::target_graph_row
              ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8);
    SVOBitset::intersect_with_complement
              (in_stack_fffffffffffffdf0,
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  else {
    HomomorphismModel::target_graph_row
              ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8);
    SVOBitset::operator&=
              (in_stack_fffffffffffffdf0,
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  uVar1 = SVOBitset::count(in_stack_fffffffffffffe00);
  uVar2 = SVOBitset::count(in_stack_fffffffffffffe00);
  if (uVar1 != uVar2) {
    std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x17299d);
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
              (in_stack_fffffffffffffe48,(int)((ulong)this_00 >> 0x20));
    HomomorphismModel::target_vertex_for_proof_abi_cxx11_
              (in_stack_fffffffffffffe48,(int)((ulong)this_00 >> 0x20));
    SVOBitset::count(in_stack_fffffffffffffe00);
    SVOBitset::count(in_stack_fffffffffffffe00);
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
              (in_stack_fffffffffffffe48,(int)((ulong)this_00 >> 0x20));
    Proof::propagated((Proof *)in_stack_fffffffffffffdf0,
                      (NamedVertex *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                      (NamedVertex *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,(NamedVertex *)0x172a60);
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x172a6f);
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x172a7c);
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x172a89);
  }
  SVOBitset::operator=
            ((SVOBitset *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0);
  for (local_13c = 1; local_13c < *(uint *)(*in_RDI + 8); local_13c = local_13c + 1) {
    if (((uint)*local_20 & 1 << ((byte)local_13c & 0x1f)) != 0) {
      in_stack_fffffffffffffe00 =
           HomomorphismModel::target_graph_row
                     ((HomomorphismModel *)
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8);
      SVOBitset::operator&=
                (in_stack_fffffffffffffdf0,
                 (SVOBitset *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    }
    uVar1 = SVOBitset::count(in_stack_fffffffffffffe00);
    uVar2 = SVOBitset::count(in_stack_fffffffffffffe00);
    if (uVar1 != uVar2) {
      in_stack_fffffffffffffdf0 =
           (SVOBitset *)
           std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x172bd1);
      HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                (in_stack_fffffffffffffe48,(int)((ulong)this_00 >> 0x20));
      HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                (in_stack_fffffffffffffe48,(int)((ulong)this_00 >> 0x20));
      in_stack_fffffffffffffde4 = local_13c;
      in_stack_fffffffffffffde8 = SVOBitset::count(in_stack_fffffffffffffe00);
      uVar2 = SVOBitset::count(in_stack_fffffffffffffe00);
      in_stack_fffffffffffffdec = in_stack_fffffffffffffde8 - uVar2;
      HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                (in_stack_fffffffffffffe48,(int)((ulong)this_00 >> 0x20));
      Proof::propagated((Proof *)in_stack_fffffffffffffdf0,
                        (NamedVertex *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)
                        ,(NamedVertex *)
                         CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                        in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,(NamedVertex *)0x172c9b)
      ;
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x172ca7);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x172cb4);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x172cc1);
    }
    SVOBitset::operator=
              ((SVOBitset *)CONCAT44(uVar1,in_stack_fffffffffffffdf8),in_stack_fffffffffffffdf0);
  }
  SVOBitset::~SVOBitset((SVOBitset *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  return;
}

Assistant:

auto HomomorphismSearcher::propagate_adjacency_constraints(HomomorphismDomain & d, const HomomorphismAssignment & current_assignment) -> void
{
    const auto & graph_pairs_to_consider = model.pattern_adjacency_bits(current_assignment.pattern_vertex, d.v);

    [[maybe_unused]] conditional_t<verbose_proofs_, SVOBitset, tuple<>> before;
    if constexpr (verbose_proofs_) {
        before = d.values;
    }

    if constexpr (! directed_) {
        // for the original graph pair, if we're adjacent...
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(0, current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.target_graph_row(0, current_assignment.target_vertex));
            }
        }
    }
    else {
        // both forward and reverse edges to consider
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.forward_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.forward_target_graph_row(current_assignment.target_vertex));
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);

        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.reverse_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.reverse_target_graph_row(current_assignment.target_vertex));
            }
        }
    }

    if constexpr (verbose_proofs_) {
        if (before.count() != d.values.count())
            proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                0, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
        before = d.values;
    }

    // and for each remaining graph pair...
    for (unsigned g = 1; g < model.max_graphs; ++g) {
        // if we're adjacent...
        if (graph_pairs_to_consider & (1u << g)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(g, current_assignment.target_vertex);
        }

        if constexpr (verbose_proofs_) {
            if (before.count() != d.values.count())
                proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                    g, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
            before = d.values;
        }
    }

    if constexpr (has_edge_labels_) {
        // if we're adjacent in the original graph, additionally the edge labels need to match up
        if (graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_forward_label = model.pattern_edge_label(current_assignment.pattern_vertex, d.v);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_forward_label = model.target_edge_label(current_assignment.target_vertex, c);
                if (got_forward_label != want_forward_label)
                    d.values.reset(c);
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);
        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_reverse_label = model.pattern_edge_label(d.v, current_assignment.pattern_vertex);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_reverse_label = model.target_edge_label(c, current_assignment.target_vertex);
                if (got_reverse_label != want_reverse_label)
                    d.values.reset(c);
            }
        }
    }
}